

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O0

void __thiscall OpenMD::Rattle::Rattle(Rattle *this,SimInfo *info)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  SimInfo *info_00;
  Snapshot *this_00;
  void *pvVar4;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  RealType RVar5;
  Globals *simParams;
  SimInfo *in_stack_fffffffffffffec8;
  errorStruct *peVar6;
  SimInfo *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  allocator<char> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  errorStruct *in_stack_ffffffffffffff20;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  Globals *local_28;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 10;
  in_RDI[2] = 0x3eb0c6f7a0b5ed8d;
  in_RDI[4] = 0;
  *(undefined1 *)(in_RDI + 5) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 6));
  in_RDI[10] = 0;
  in_RDI[0xc] = 0;
  uVar3 = SimInfo::getNGlobalConstraints(in_stack_fffffffffffffed0);
  if (uVar3 != 0) {
    *(undefined1 *)(in_RDI + 5) = 1;
  }
  if ((*(byte *)(in_RDI + 5) & 1) != 0) {
    local_28 = SimInfo::getSimParams((SimInfo *)*in_RDI);
    bVar1 = Globals::haveDt((Globals *)0x32ab71);
    if (bVar1) {
      RVar5 = Globals::getDt((Globals *)0x32ab8e);
      in_RDI[3] = RVar5;
    }
    else {
      in_stack_ffffffffffffff20 = &painCave;
      snprintf(painCave.errMsg,2000,"Rattle Error: dt is not set\n");
      in_stack_ffffffffffffff20->isFatal = 1;
      simError();
    }
    info_00 = (SimInfo *)SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
    this_00 = SnapshotManager::getCurrentSnapshot((SnapshotManager *)info_00);
    in_RDI[4] = this_00;
    uVar2 = Globals::haveConstraintTime((Globals *)0x32ac28);
    if ((bool)uVar2) {
      in_stack_ffffffffffffff00 = (allocator<char> *)Globals::getConstraintTime((Globals *)0x32ac45)
      ;
      in_RDI[0xb] = in_stack_ffffffffffffff00;
    }
    else {
      RVar5 = Globals::getStatusTime((Globals *)0x32ac6f);
      in_RDI[0xb] = RVar5;
    }
    SimInfo::getFinalConfigFileName_abi_cxx11_(in_stack_fffffffffffffec8);
    getPrefix(in_stack_fffffffffffffed8);
    std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
    std::__cxx11::string::operator=((string *)(in_RDI + 6),local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    pvVar4 = operator_new(0x208);
    std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffff08),in_stack_ffffffffffffff00);
    ConstraintWriter::ConstraintWriter
              ((ConstraintWriter *)in_stack_ffffffffffffff20,info_00,(string *)this_00);
    in_RDI[10] = pvVar4;
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    if (in_RDI[10] == 0) {
      peVar6 = &painCave;
      snprintf(painCave.errMsg,2000,"Failed to create ConstraintWriter\n");
      peVar6->isFatal = 1;
      simError();
    }
  }
  return;
}

Assistant:

Rattle::Rattle(SimInfo* info) :
      info_(info), maxConsIteration_(10), consTolerance_(1.0e-6),
      doRattle_(false), currConstraintTime_(0.0) {
    if (info_->getNGlobalConstraints() > 0) doRattle_ = true;

    if (!doRattle_) return;

    Globals* simParams = info_->getSimParams();

    if (simParams->haveDt()) {
      dt_ = simParams->getDt();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Rattle Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (simParams->haveConstraintTime()) {
      constraintTime_ = simParams->getConstraintTime();
    } else {
      constraintTime_ = simParams->getStatusTime();
    }

    constraintOutputFile_ =
        getPrefix(info_->getFinalConfigFileName()) + ".constraintForces";

    // create ConstraintWriter
    constraintWriter_ =
        new ConstraintWriter(info_, constraintOutputFile_.c_str());

    if (!constraintWriter_) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Failed to create ConstraintWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }